

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_dbref(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined8 uVar5;
  void *pvVar6;
  void *pvVar7;
  char *pcVar8;
  undefined1 *__n;
  undefined1 *__s1;
  undefined8 uVar9;
  undefined1 *puVar10;
  char *pcVar11;
  void *__s2;
  undefined1 *puVar12;
  int *piVar13;
  double *pdVar14;
  long *plVar15;
  undefined8 extraout_RAX;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  long lVar19;
  int *piVar20;
  ulong uVar21;
  char *pcVar22;
  ulong uVar23;
  char *pcVar24;
  undefined **ppuVar25;
  void *pvVar26;
  undefined **ppuVar27;
  int *piVar28;
  double dVar29;
  int extraout_XMM0_Db;
  dbref_test_t tests [4];
  bson_t b;
  bson_error_t error;
  code **ppcVar30;
  undefined4 uStack_395c;
  undefined8 uStack_3958;
  undefined2 uStack_3950;
  int iStack_3948;
  int iStack_3944;
  char acStack_3940 [504];
  code *pcStack_3748;
  undefined1 auStack_3738 [512];
  char *pcStack_3538;
  code *pcStack_3530;
  int iStack_3520;
  int iStack_351c;
  char acStack_3518 [504];
  long *plStack_3320;
  double *pdStack_3318;
  char *pcStack_3310;
  code *pcStack_3308;
  long lStack_3290;
  long lStack_3288;
  undefined1 auStack_3280 [128];
  undefined1 auStack_3200 [232];
  undefined1 auStack_3118 [608];
  long *plStack_2eb8;
  code *pcStack_2eb0;
  undefined1 auStack_2ea8 [8];
  char acStack_2ea0 [16];
  char *pcStack_2e90;
  code *pcStack_2e88;
  uint uStack_2e04;
  undefined8 uStack_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 uStack_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined1 auStack_2d38 [648];
  int *piStack_2ab0;
  double *pdStack_2aa8;
  undefined **ppuStack_2aa0;
  int *piStack_2a98;
  int *piStack_2a90;
  code *pcStack_2a88;
  undefined1 auStack_2a80 [240];
  undefined1 auStack_2990 [648];
  code *apcStack_2708 [16];
  double dStack_2688;
  int aiStack_2680 [50];
  int iStack_25b8;
  int iStack_25b4;
  int aiStack_25b0 [160];
  int *piStack_2330;
  double *pdStack_2328;
  undefined **ppuStack_2320;
  int *piStack_2318;
  int *piStack_2310;
  code *apcStack_2308 [16];
  double dStack_2288;
  int aiStack_2280 [50];
  int iStack_21b8;
  int iStack_21b4;
  int aiStack_21b0 [160];
  undefined8 uStack_1f30;
  undefined1 *puStack_1f28;
  char *pcStack_1f20;
  char *pcStack_1f18;
  undefined **ppuStack_1f10;
  code *pcStack_1f08;
  int iStack_1f00;
  int iStack_1efc;
  char acStack_1ef8 [504];
  undefined1 auStack_1d00 [336];
  char *pcStack_1bb0;
  undefined1 *puStack_1ba8;
  undefined1 *puStack_1ba0;
  void *pvStack_1b98;
  void *pvStack_1b90;
  code *pcStack_1b88;
  undefined1 auStack_1b80 [128];
  char acStack_1b00 [232];
  undefined1 auStack_1a18 [648];
  char *pcStack_1790;
  code *pcStack_1788;
  undefined1 auStack_1780 [128];
  char acStack_1700 [224];
  int iStack_1620;
  int iStack_161c;
  char acStack_1618 [640];
  char *pcStack_1398;
  void *pvStack_1390;
  code *pcStack_1388;
  undefined1 auStack_1380 [128];
  char acStack_1300 [232];
  undefined1 auStack_1218 [648];
  char *pcStack_f90;
  code *pcStack_f88;
  undefined1 auStack_f80 [232];
  int iStack_e98;
  int iStack_e94;
  char acStack_e90 [640];
  char *pcStack_c10;
  code *apcStack_c08 [16];
  uint uStack_b84;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  undefined1 auStack_ab8 [648];
  undefined1 *puStack_830;
  undefined1 *puStack_828;
  undefined1 *puStack_820;
  void *pvStack_818;
  void *pvStack_810;
  code *apcStack_808 [2];
  void *pvStack_7f8;
  char *pcStack_7f0;
  void *pvStack_7e8;
  char *pcStack_7e0;
  void *pvStack_7d8;
  char *pcStack_7d0;
  undefined1 *puStack_7c8;
  char *pcStack_7c0;
  undefined1 *puStack_7b8;
  char *pcStack_7b0;
  undefined8 uStack_7a8;
  char *pcStack_7a0;
  undefined8 uStack_798;
  char *pcStack_790;
  undefined8 uStack_788;
  undefined1 auStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [592];
  undefined8 uStack_468;
  char *pcStack_460;
  char *pcStack_458;
  char *pcStack_450;
  char *pcStack_448;
  char *pcStack_440;
  char *pcStack_438;
  char *pcStack_430;
  char *pcStack_428;
  char *pcStack_420;
  char *pcStack_418;
  char *pcStack_410;
  code *apcStack_408 [7];
  void *local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  void *local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  void *local_398;
  char *local_390;
  undefined8 local_388;
  char local_380 [4];
  uint local_37c;
  undefined1 local_2b8 [648];
  
  apcStack_408[0] = (code *)0x131616;
  uVar5 = bson_bcon_magic();
  if (oid_zero_initialized == '\0') {
    apcStack_408[0] = (code *)0x131635;
    bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
    oid_zero_initialized = '\x01';
  }
  pvVar26 = (void *)0x0;
  pcVar24 = "$ref";
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = oid_zero_oid;
  pcStack_428 = (char *)0x6;
  pcStack_438 = "$id";
  pcStack_440 = "collection";
  pcStack_448 = (char *)0x131696;
  pcStack_430 = (char *)uVar5;
  local_3d0 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = (char *)0x1;
  pcStack_428 = (char *)0xf;
  pcStack_438 = "$id";
  pcStack_440 = "collection";
  pcStack_448 = (char *)0x1316e6;
  pcStack_430 = (char *)uVar5;
  local_3c8 = bcon_new(0,"key","{","$ref",uVar5,0);
  apcStack_408[0] = (code *)0x0;
  pcStack_410 = "}";
  pcStack_418 = "}";
  pcStack_420 = (char *)0x1;
  pcStack_428 = (char *)0xf;
  pcStack_438 = "a";
  pcStack_440 = "{";
  pcStack_448 = "$id";
  pcStack_450 = "collection";
  pcStack_458 = (char *)0x13173e;
  pcStack_430 = (char *)uVar5;
  pvVar6 = (void *)bcon_new(0,"key","{","$ref",uVar5,0);
  pcStack_410 = (char *)0x0;
  pcStack_418 = "}";
  pcStack_420 = (char *)0x1;
  pcStack_428 = (char *)0x7;
  pcStack_438 = "meta";
  pcStack_440 = (char *)0x1;
  pcStack_448 = (char *)0xf;
  pcStack_458 = "$id";
  pcStack_460 = "collection";
  uStack_468 = 0x1317a1;
  pcStack_450 = (char *)uVar5;
  pcStack_430 = (char *)uVar5;
  local_388 = bcon_new(0,"key","{","$ref",uVar5,0);
  local_3c0 = 
  "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
  local_3b8 = local_3d0;
  local_3b0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
  local_3a8 = local_3c8;
  local_3a0 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
  local_398 = pvVar6;
  local_390 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
  pcVar11 = "key";
  while( true ) {
    apcStack_408[0] = (code *)0x131817;
    cVar1 = bson_init_from_json(local_380,*(undefined8 *)((long)&local_3c0 + (long)pvVar26),
                                0xffffffffffffffff,local_2b8);
    pcVar22 = local_380;
    pvVar7 = pvVar26;
    if (cVar1 == '\0') break;
    apcStack_408[0] = (code *)0x13182a;
    local_3d0 = (void *)bson_get_data(local_380);
    pcVar22 = *(char **)((long)&local_3b8 + (long)pvVar26);
    apcStack_408[0] = (code *)0x13183c;
    pvVar7 = (void *)bson_get_data(pcVar22);
    if (*(uint *)(pcVar22 + 4) != local_37c) {
LAB_001318b1:
      apcStack_408[0] = (code *)0x1318c3;
      pcVar24 = (char *)bson_as_canonical_extended_json(local_380);
      apcStack_408[0] = (code *)0x1318d0;
      uVar5 = bson_as_canonical_extended_json(pcVar22);
      pvVar6 = local_3d0;
      uVar18 = 0xffffffff;
      if (local_37c == 0) goto LAB_00131915;
      uVar21 = 0;
      goto LAB_001318fb;
    }
    apcStack_408[0] = (code *)0x131853;
    pcVar24 = (char *)bson_get_data(pcVar22);
    apcStack_408[0] = (code *)0x13185e;
    pvVar6 = (void *)bson_get_data(local_380);
    apcStack_408[0] = (code *)0x13186c;
    iVar2 = bcmp(pcVar24,pvVar6,(ulong)*(uint *)(pcVar22 + 4));
    if (iVar2 != 0) goto LAB_001318b1;
    apcStack_408[0] = (code *)0x13187b;
    bson_destroy(local_380);
    pvVar26 = (void *)((long)pvVar26 + 0x10);
    pcVar11 = local_380;
    pvVar6 = pvVar7;
    if (pvVar26 == (void *)0x40) {
      lVar19 = 8;
      do {
        apcStack_408[0] = (code *)0x131898;
        bson_destroy(*(undefined8 *)((long)&local_3c0 + lVar19));
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x48);
      return;
    }
  }
  goto LAB_001319dd;
  while( true ) {
    if (*(char *)((long)local_3d0 + uVar21) != *(char *)((long)pvVar7 + uVar21)) {
      uVar18 = uVar21 & 0xffffffff;
      break;
    }
    uVar21 = uVar21 + 1;
    if (local_37c == (uint)uVar21) break;
LAB_001318fb:
    if (*(int *)(pcVar22 + 4) == (int)uVar21) break;
  }
LAB_00131915:
  if ((int)uVar18 == -1) {
    uVar3 = local_37c;
    if (local_37c < *(uint *)(pcVar22 + 4)) {
      uVar3 = *(uint *)(pcVar22 + 4);
    }
    uVar18 = (ulong)(uVar3 - 1);
  }
  apcStack_408[0] = (code *)0x131945;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar18,pcVar24,uVar5);
  apcStack_408[0] = (code *)0x13195d;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar11 = (char *)(ulong)uVar3;
  apcStack_408[0] = (code *)0x131978;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  local_3d0 = (void *)CONCAT44(local_3d0._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_001319c9:
    apcStack_408[0] = (code *)0x1319ce;
    test_bson_json_dbref_cold_6();
LAB_001319ce:
    apcStack_408[0] = (code *)0x1319d3;
    test_bson_json_dbref_cold_5();
LAB_001319d3:
    apcStack_408[0] = (code *)0x1319d8;
    test_bson_json_dbref_cold_2();
  }
  else {
    pcVar24 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_001319ce;
    pcVar11 = (char *)(ulong)local_37c;
    apcStack_408[0] = (code *)0x1319a2;
    pcVar8 = (char *)write(uVar3,pvVar6,(size_t)pcVar11);
    if (pcVar8 != pcVar11) goto LAB_001319d3;
    pcVar22 = (char *)(ulong)*(uint *)(pcVar22 + 4);
    apcStack_408[0] = (code *)0x1319b8;
    pcVar8 = (char *)write(uVar4,pvVar7,(size_t)pcVar22);
    if (pcVar8 == pcVar22) {
      apcStack_408[0] = (code *)0x1319c9;
      test_bson_json_dbref_cold_4();
      goto LAB_001319c9;
    }
  }
  apcStack_408[0] = (code *)0x1319dd;
  test_bson_json_dbref_cold_3();
LAB_001319dd:
  apcStack_408[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  apcStack_808[0] = (code *)0x131a07;
  pcStack_430 = pcVar22;
  pcStack_428 = pcVar11;
  pcStack_420 = pcVar24;
  pcStack_418 = (char *)pvVar7;
  pcStack_410 = (char *)pvVar6;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  uVar5 = bson_bcon_magic();
  apcStack_808[0] = (code *)0x131a29;
  pvStack_7f8 = (void *)bcon_new(0,"euro",uVar5,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_808[0] = (code *)0x131a4d;
  pvVar6 = (void *)bcon_new(0,"crlf",uVar5,0,"\r\n",0);
  apcStack_808[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar5,0,"\"",0);
  apcStack_808[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar5,0,"\\",0);
  apcStack_808[0] = (code *)0x131aaf;
  uVar9 = bcon_new(0,"",uVar5,0,"",0);
  apcStack_808[0] = (code *)0x131ad1;
  uVar5 = bcon_new(0,"escapes",uVar5,0,"\f\b\t",0);
  apcStack_808[0] = (code *)0x131ad9;
  uStack_788 = bson_new();
  pcStack_7f0 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_7e8 = pvStack_7f8;
  pcStack_7e0 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_7d0 = "{ \"quote\": \"\\\"\"}";
  pcStack_7c0 = "{ \"backslash\": \"\\\\\"}";
  pcStack_7b0 = "{ \"\": \"\"}";
  pcStack_7a0 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_790 = "{ \"nil\": \"\\u0000\"}";
  apcStack_808[0] = (code *)0x131b76;
  pvStack_7d8 = pvVar6;
  puStack_7c8 = __n;
  puStack_7b8 = __s1;
  uStack_7a8 = uVar9;
  uStack_798 = uVar5;
  bson_append_utf8(uStack_788,"nil",0xffffffff,"",1);
  pvVar26 = (void *)0x8;
  while( true ) {
    apcStack_808[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(auStack_780,*(undefined8 *)((long)&pvStack_7f8 + (long)pvVar26),
                                0xffffffffffffffff,auStack_6b8);
    puVar12 = auStack_780;
    pvVar7 = pvVar26;
    if (cVar1 == '\0') break;
    apcStack_808[0] = (code *)0x131bb3;
    pvStack_7f8 = (void *)bson_get_data(auStack_780);
    puVar12 = *(undefined1 **)((long)&pcStack_7f0 + (long)pvVar26);
    apcStack_808[0] = (code *)0x131bc5;
    pvVar7 = (void *)bson_get_data(puVar12);
    if (*(uint *)(puVar12 + 4) != uStack_77c) {
LAB_00131c3a:
      apcStack_808[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(auStack_780);
      apcStack_808[0] = (code *)0x131c59;
      uVar5 = bson_as_canonical_extended_json(puVar12);
      pvVar6 = pvStack_7f8;
      uVar18 = 0xffffffff;
      if (uStack_77c == 0) goto LAB_00131c9e;
      uVar21 = 0;
      goto LAB_00131c84;
    }
    apcStack_808[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar12);
    apcStack_808[0] = (code *)0x131be7;
    pvVar6 = (void *)bson_get_data(auStack_780);
    apcStack_808[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar6,(ulong)*(uint *)(puVar12 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_808[0] = (code *)0x131c04;
    bson_destroy(auStack_780);
    pvVar26 = (void *)((long)pvVar26 + 0x10);
    __n = auStack_780;
    pvVar6 = pvVar7;
    if (pvVar26 == (void *)0x78) {
      lVar19 = 8;
      do {
        apcStack_808[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&pcStack_7f0 + lVar19));
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x78);
      return;
    }
  }
LAB_00131d66:
  apcStack_808[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_c08[0] = (code *)0x131d90;
  puStack_830 = puVar12;
  puStack_828 = __n;
  puStack_820 = __s1;
  pvStack_818 = pvVar7;
  pvStack_810 = pvVar6;
  apcStack_808[0] = (code *)apcStack_408;
  uVar5 = bson_bcon_magic();
  apcStack_c08[0] = (code *)0x131daf;
  pcVar11 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar5,0,"euro",0);
  apcStack_c08[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_b80,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,auStack_ab8)
  ;
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_c08[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_c08[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_c08[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_c08[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_c08[0] = (code *)0x131ded;
    pvVar6 = (void *)bson_get_data(auStack_b80);
    apcStack_c08[0] = (code *)0x131df8;
    pvVar7 = (void *)bson_get_data(pcVar11);
    if (*(uint *)(pcVar11 + 4) == uStack_b7c) {
      apcStack_c08[0] = (code *)0x131e0d;
      pvVar26 = (void *)bson_get_data(pcVar11);
      apcStack_c08[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_b80);
      apcStack_c08[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar26,__s2,(ulong)*(uint *)(pcVar11 + 4));
      if (iVar2 == 0) {
        apcStack_c08[0] = (code *)0x131e3c;
        bson_destroy(auStack_b80);
        apcStack_c08[0] = (code *)0x131e44;
        bson_destroy(pcVar11);
        return;
      }
    }
    __s1 = auStack_b80;
    apcStack_c08[0] = (code *)0x131e65;
    uVar5 = bson_as_canonical_extended_json(__s1);
    apcStack_c08[0] = (code *)0x131e72;
    uVar9 = bson_as_canonical_extended_json(pcVar11);
    uVar18 = 0xffffffff;
    if (uStack_b7c != 0) {
      uVar21 = 0;
      do {
        if (*(int *)(pcVar11 + 4) == (int)uVar21) break;
        if (*(char *)((long)pvVar6 + uVar21) != *(char *)((long)pvVar7 + uVar21)) {
          uVar18 = uVar21 & 0xffffffff;
          break;
        }
        uVar21 = uVar21 + 1;
      } while (uStack_b7c != (uint)uVar21);
    }
    if ((int)uVar18 == -1) {
      uVar3 = uStack_b7c;
      if (uStack_b7c < *(uint *)(pcVar11 + 4)) {
        uVar3 = *(uint *)(pcVar11 + 4);
      }
      uVar18 = (ulong)(uVar3 - 1);
    }
    apcStack_c08[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar18,uVar5,uVar9);
    apcStack_c08[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_c08[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_b84 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_b7c;
    apcStack_c08[0] = (code *)0x131f2a;
    puVar12 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
    if (puVar12 != __n) goto LAB_00131f60;
    pcVar11 = (char *)(ulong)*(uint *)(pcVar11 + 4);
    apcStack_c08[0] = (code *)0x131f40;
    pcVar24 = (char *)write(uVar4,pvVar7,(size_t)pcVar11);
    if (pcVar24 == pcVar11) {
      apcStack_c08[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_c08[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_f88 = (code *)0x131f98;
  pcStack_c10 = pcVar11;
  apcStack_c08[0] = (code *)apcStack_808;
  cVar1 = bson_init_from_json(auStack_f80,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_e98);
  if (cVar1 == '\0') {
    if (iStack_e98 != 1) goto LAB_00131fe4;
    if (iStack_e94 != 1) goto LAB_00131fe9;
    pcVar11 = acStack_e90;
    pcStack_f88 = (code *)0x131fcb;
    pcVar24 = strstr(pcVar11,"UESCAPE_TOOSHORT");
    if (pcVar24 != (char *)0x0) {
      pcStack_f88 = (code *)0x131fd8;
      bson_destroy(auStack_f80);
      return;
    }
  }
  else {
    pcStack_f88 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_f88 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_f88 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_f88 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_1388 = (code *)0x132029;
  pcStack_f90 = pcVar11;
  pcStack_f88 = (code *)apcStack_c08;
  cVar1 = bson_init_from_json(acStack_1300,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_1218);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_1388 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_1388 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_1388 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_1388 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') {
      pcStack_1388 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_1388 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_1388 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_1388 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_1388 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_1388 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_1388 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_1388 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_1388 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_1388 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_1380);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar11 = acStack_1300;
    pcStack_1388 = (code *)0x132084;
    bson_destroy(pcVar11);
    pcStack_1388 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_1218);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_1388 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_1380,acStack_1300,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_1388 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_1380);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_1388 = (code *)0x1320e2;
    bson_iter_int32(auStack_1380);
  }
  pcStack_1388 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_1388 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_1388 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_1388 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_1388 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_1788 = (code *)0x1322a4;
  pcStack_1398 = pcVar11;
  pvStack_1390 = pvVar7;
  pcStack_1388 = (code *)&pcStack_f88;
  cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_1620);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_1788 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_1788 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_1788 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_1788 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_1788 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_1788 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_1788 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_1788 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_1788 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_1788 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_1788 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_1788 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_1788 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_1788 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_1788 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_1788 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') {
      pcStack_1788 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_1788 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_1788 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_1788 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_1788 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_1788 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_1788 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_1788 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_1788 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x12) goto LAB_0013251a;
    pvVar7 = (void *)0x7fffffffffffffff;
    pcStack_1788 = (code *)0x1322ee;
    lVar19 = bson_iter_int64(auStack_1780);
    if (lVar19 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar11 = acStack_1700;
    pcStack_1788 = (code *)0x132307;
    bson_destroy(pcVar11);
    pcStack_1788 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_1788 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_1780,acStack_1700,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_1788 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_1780);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_1788 = (code *)0x132365;
    lVar19 = bson_iter_int64(auStack_1780);
    pvVar7 = (void *)0x8000000000000000;
    if (lVar19 != -0x8000000000000000) goto LAB_0013255f;
    pcVar11 = acStack_1700;
    pcStack_1788 = (code *)0x132381;
    bson_destroy(pcVar11);
    pcStack_1788 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_1620 != 1) goto LAB_00132567;
    if (iStack_161c != 2) goto LAB_0013256c;
    pcVar11 = acStack_1618;
    pcStack_1788 = (code *)0x1323de;
    pcVar24 = strstr(pcVar11,"Number \"9223372036854775808\" is out of range");
    if (pcVar24 == (char *)0x0) goto LAB_00132571;
    pcStack_1788 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_1620 != 1) goto LAB_00132579;
    if (iStack_161c != 2) goto LAB_0013257e;
    pcStack_1788 = (code *)0x132441;
    pcVar24 = strstr(pcVar11,"Number \"-9223372036854775809\" is out of range");
    if (pcVar24 == (char *)0x0) goto LAB_00132583;
    pcStack_1788 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_1620 != 1) goto LAB_0013258b;
    if (iStack_161c != 2) goto LAB_00132590;
    pcStack_1788 = (code *)0x1324a4;
    pcVar24 = strstr(pcVar11,"Number \"10000000000000000000\" is out of range");
    if (pcVar24 == (char *)0x0) goto LAB_00132595;
    pcStack_1788 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_1700,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_1620);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_1620 != 1) goto LAB_0013259d;
    if (iStack_161c != 2) goto LAB_001325a2;
    pcStack_1788 = (code *)0x132503;
    pcVar24 = strstr(pcVar11,"Number \"-10000000000000000000\" is out of range");
    if (pcVar24 != (char *)0x0) {
      return;
    }
  }
  pcStack_1788 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_1b88 = (code *)0x1325e2;
  pcStack_1790 = pcVar11;
  pcStack_1788 = (code *)&pcStack_1388;
  cVar1 = bson_init_from_json(acStack_1b00,"{ \"x\": 1 }",0xffffffffffffffff,auStack_1a18);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_1b88 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_1b88 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_1b88 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_1b88 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_1b88 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_1b88 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_1b88 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_1b88 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_1b88 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_1b88 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') {
      pcStack_1b88 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_1b88 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_1b88 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_1b88 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_1b88 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_1b88 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_1b88 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_1b88 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_1b88 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_1b88 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_1b88 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_1b88 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_1b88 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_1b80);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar11 = acStack_1b00;
    pcStack_1b88 = (code *)0x13263b;
    bson_destroy(pcVar11);
    pcStack_1b88 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_1b88 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_1b88 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_1b88 = (code *)0x132699;
    lVar19 = bson_iter_int64(auStack_1b80);
    if (lVar19 != 0x100000000) goto LAB_001328a9;
    pcVar11 = acStack_1b00;
    pcStack_1b88 = (code *)0x1326bc;
    bson_destroy(pcVar11);
    pcStack_1b88 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_1b88 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_1b88 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_1b88 = (code *)0x13271a;
    dVar29 = (double)bson_iter_double(auStack_1b80);
    if ((dVar29 != 1.0) || (NAN(dVar29))) goto LAB_001328be;
    pcVar11 = acStack_1b00;
    pcStack_1b88 = (code *)0x13273e;
    bson_destroy(pcVar11);
    pcStack_1b88 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_1b88 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_1b88 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_1b88 = (code *)0x13279c;
    dVar29 = (double)bson_iter_double(auStack_1b80);
    if ((dVar29 != 0.0) || (NAN(dVar29))) goto LAB_001328d3;
    pcVar11 = acStack_1b00;
    pcStack_1b88 = (code *)0x1327c0;
    bson_destroy(pcVar11);
    pcStack_1b88 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_1a18);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_1b88 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_1b80,acStack_1b00,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_1b88 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_1b80);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_1b88 = (code *)0x132816;
    dVar29 = (double)bson_iter_double(auStack_1b80);
    if ((dVar29 == 0.0) && (!NAN(dVar29))) {
      pcStack_1b88 = (code *)0x132832;
      bson_iter_double(auStack_1b80);
      if (extraout_XMM0_Db < 0) {
        pcStack_1b88 = (code *)0x132849;
        bson_destroy(acStack_1b00);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_1b88 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar24 = "2e400";
  ppuVar27 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_1bb0 = pcVar11;
  puStack_1ba8 = __n;
  puStack_1ba0 = __s1;
  pvStack_1b98 = pvVar7;
  pvStack_1b90 = pvVar6;
  pcStack_1b88 = (code *)&pcStack_1788;
  while( true ) {
    pcStack_1f08 = (code *)0x13292e;
    uVar5 = bson_strdup_printf("{ \"d\" : %s }",pcVar24);
    pcStack_1f08 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_1d00,uVar5,0xffffffffffffffff,&iStack_1f00);
    if (cVar1 != '\0') break;
    if (iStack_1f00 != 1) goto LAB_00132a15;
    if (iStack_1efc != 2) goto LAB_00132a10;
    pcStack_1f08 = (code *)0x132979;
    pcVar11 = strstr(acStack_1ef8,"out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132a1a;
    pcStack_1f08 = (code *)0x13298a;
    bson_free(uVar5);
    pcStack_1f08 = (code *)0x13299b;
    uVar5 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar24);
    pcStack_1f08 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_1d00,uVar5,0xffffffffffffffff,&iStack_1f00);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_1f00 != 1) goto LAB_00132a29;
    if (iStack_1efc != 2) goto LAB_00132a24;
    pcStack_1f08 = (code *)0x1329da;
    pcVar11 = strstr(acStack_1ef8,"out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132a2e;
    pcStack_1f08 = (code *)0x1329e7;
    bson_free(uVar5);
    pcVar24 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar24 == (char *)0x0) {
      return;
    }
  }
  pcStack_1f08 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_1f08 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_1f08 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_1f08 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_1f08 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_1f08 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_1f08 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_1f08 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_1f20 = "out of range";
  pcVar22 = "{ \"d\": NaN }";
  ppuVar25 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar20 = aiStack_2280;
  piVar13 = &iStack_21b8;
  piVar28 = (int *)0x14a6f6;
  pcVar11 = (char *)&dStack_2288;
  uStack_1f30 = uVar5;
  puStack_1f28 = (undefined1 *)&iStack_1f00;
  pcStack_1f18 = pcVar24;
  ppuStack_1f10 = ppuVar27;
  pcStack_1f08 = (code *)&pcStack_1b88;
  do {
    apcStack_2308[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar20,pcVar22,0xffffffffffffffff,piVar13);
    if (cVar1 == '\0') {
      apcStack_2308[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_2308[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_2308[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_2308[0] = (code *)0x132a99;
    uVar5 = bson_bcone_magic();
    apcStack_2308[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar20,"d",uVar5,1,pcVar11,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_2288) && !NAN(dStack_2288)) goto LAB_00132bfa;
    apcStack_2308[0] = (code *)0x132ad4;
    bson_destroy(piVar20);
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar22 != (char *)0x0);
  pcVar24 = "{ \"d\": NaNn }";
  ppuVar25 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar20 = aiStack_21b0;
  piVar13 = aiStack_2280;
  piVar28 = &iStack_21b8;
  pcVar11 = "Got parse error at";
  do {
    apcStack_2308[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar13,pcVar24,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_21b8 != 1) goto LAB_00132c16;
    if (iStack_21b4 != 1) goto LAB_00132c09;
    apcStack_2308[0] = (code *)0x132b53;
    pcVar24 = strstr((char *)piVar20,"Got parse error at");
    if (pcVar24 == (char *)0x0) goto LAB_00132c0e;
    pcVar24 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
  } while (pcVar24 != (char *)0x0);
  pcVar24 = "{ \"d\": nu";
  ppuVar25 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar20 = aiStack_21b0;
  piVar13 = aiStack_2280;
  piVar28 = &iStack_21b8;
  pcVar11 = "Incomplete JSON";
  while( true ) {
    apcStack_2308[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar13,pcVar24,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') break;
    if (iStack_21b8 != 1) goto LAB_00132c28;
    if (iStack_21b4 != 1) goto LAB_00132c1b;
    apcStack_2308[0] = (code *)0x132bcf;
    pcVar24 = strstr((char *)piVar20,"Incomplete JSON");
    if (pcVar24 == (char *)0x0) goto LAB_00132c20;
    pcVar24 = *ppuVar25;
    ppuVar25 = ppuVar25 + 1;
    if (pcVar24 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_2308[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_2308[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_2308[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_2308[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_2308[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_2308[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_2308[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar24 = "{ \"d\": Infinity }";
  ppuVar27 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_2330 = piVar20;
  pdStack_2328 = (double *)pcVar11;
  ppuStack_2320 = ppuVar25;
  piStack_2318 = piVar13;
  piStack_2310 = piVar28;
  apcStack_2308[0] = (code *)&pcStack_1f08;
  do {
    apcStack_2708[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_2680,pcVar24,0xffffffffffffffff,&iStack_25b8);
    if (cVar1 == '\0') {
      apcStack_2708[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_2708[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_2708[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_2708[0] = (code *)0x132c8e;
    uVar5 = bson_bcone_magic();
    apcStack_2708[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_2680,"d",uVar5,1,&dStack_2688,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_2688)) || (!NAN(dStack_2688 - dStack_2688) && !NAN(dStack_2688 - dStack_2688)))
    goto LAB_00132eb6;
    apcStack_2708[0] = (code *)0x132cd7;
    bson_destroy(aiStack_2680);
    pcVar24 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar24 != (char *)0x0);
  pcVar11 = "{ \"d\": -Infinity }";
  ppuVar27 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_2708[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_2680,pcVar11,0xffffffffffffffff,&iStack_25b8);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_2708[0] = (code *)0x132d2d;
    uVar5 = bson_bcone_magic();
    apcStack_2708[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_2680,"d",uVar5,1,&dStack_2688,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_2688)) || (!NAN(dStack_2688 - dStack_2688))) goto LAB_00132ec5;
    if (0.0 <= dStack_2688) goto LAB_00132eca;
    apcStack_2708[0] = (code *)0x132d88;
    bson_destroy(aiStack_2680);
    pcVar11 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar24 = "{ \"d\": Infinityy }";
  ppuVar27 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar20 = aiStack_25b0;
  piVar13 = aiStack_2680;
  piVar28 = &iStack_25b8;
  pcVar11 = "Got parse error at";
  do {
    apcStack_2708[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar13,pcVar24,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_25b8 != 1) goto LAB_00132ee6;
    if (iStack_25b4 != 1) goto LAB_00132ed9;
    apcStack_2708[0] = (code *)0x132e0b;
    pcVar24 = strstr((char *)piVar20,"Got parse error at");
    if (pcVar24 == (char *)0x0) goto LAB_00132ede;
    pcVar24 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar24 != (char *)0x0);
  pcVar24 = "{ \"d\": In";
  ppuVar27 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar20 = aiStack_25b0;
  piVar13 = aiStack_2680;
  piVar28 = &iStack_25b8;
  pcVar11 = "Incomplete JSON";
  while( true ) {
    apcStack_2708[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar13,pcVar24,0xffffffffffffffff,piVar28);
    if (cVar1 != '\0') break;
    if (iStack_25b8 != 1) goto LAB_00132ef8;
    if (iStack_25b4 != 1) goto LAB_00132eeb;
    apcStack_2708[0] = (code *)0x132e8b;
    pcVar24 = strstr((char *)piVar20,"Incomplete JSON");
    if (pcVar24 == (char *)0x0) goto LAB_00132ef0;
    pcVar24 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar24 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_2708[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_2708[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_2708[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_2708[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_2708[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_2708[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_2708[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_2a88 = (code *)0x132f2a;
  apcStack_2708[0] = (code *)apcStack_2308;
  cVar1 = bson_init_from_json(auStack_2a80,"{ \"x\": null }",0xffffffffffffffff,auStack_2990);
  if (cVar1 == '\0') {
    pcStack_2a88 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_2a88 = (code *)0x132f33;
    uVar5 = bson_bcone_magic();
    pcStack_2a88 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_2a80,"x",uVar5,9,0);
    if (cVar1 != '\0') {
      pcStack_2a88 = (code *)0x132f5b;
      bson_destroy(auStack_2a80);
      return;
    }
  }
  pcStack_2a88 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_2e88 = (code *)0x0;
  pcStack_2e90 = "}";
  acStack_2ea0[8] = -0x52;
  acStack_2ea0[9] = '/';
  acStack_2ea0[10] = '\x13';
  acStack_2ea0[0xb] = '\0';
  acStack_2ea0[0xc] = '\0';
  acStack_2ea0[0xd] = '\0';
  acStack_2ea0[0xe] = '\0';
  acStack_2ea0[0xf] = '\0';
  piStack_2ab0 = piVar20;
  pdStack_2aa8 = (double *)pcVar11;
  ppuStack_2aa0 = ppuVar27;
  piStack_2a98 = piVar13;
  piStack_2a90 = piVar28;
  pcStack_2a88 = (code *)apcStack_2708;
  uVar18 = bcon_new(0,"a","{","b","{");
  uStack_2d90 = 0;
  uStack_2d88 = 0;
  uStack_2da0 = 0;
  uStack_2d98 = 0;
  uStack_2db0 = 0;
  uStack_2da8 = 0;
  uStack_2dc0 = 0;
  uStack_2db8 = 0;
  uStack_2dd0 = 0;
  uStack_2dc8 = 0;
  uStack_2de0 = 0;
  uStack_2dd8 = 0;
  uStack_2df0 = 0;
  uStack_2de8 = 0;
  uStack_2e00 = (undefined *)0x500000003;
  uStack_2df8 = 5;
  pcStack_2e88 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_2e00,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_2d38);
  if (cVar1 != '\0') {
    pcStack_2e88 = (code *)0x133023;
    piVar28 = (int *)bson_get_data(&uStack_2e00);
    pcStack_2e88 = (code *)0x13302e;
    piVar13 = (int *)bson_get_data(uVar18);
    if (*(int *)(uVar18 + 4) == uStack_2e00._4_4_) {
      pcStack_2e88 = (code *)0x133043;
      pvVar6 = (void *)bson_get_data(uVar18);
      pcStack_2e88 = (code *)0x133053;
      pvVar26 = (void *)bson_get_data(&uStack_2e00);
      pcStack_2e88 = (code *)0x133061;
      iVar2 = bcmp(pvVar6,pvVar26,(ulong)*(uint *)(uVar18 + 4));
      if (iVar2 == 0) {
        pcStack_2e88 = (code *)0x133072;
        bson_destroy(&uStack_2e00);
        pcStack_2e88 = (code *)0x13307a;
        bson_destroy(uVar18);
        return;
      }
    }
    ppuVar27 = (undefined **)&uStack_2e00;
    pcStack_2e88 = (code *)0x13309b;
    uVar5 = bson_as_canonical_extended_json(ppuVar27);
    pcStack_2e88 = (code *)0x1330a8;
    uVar9 = bson_as_canonical_extended_json(uVar18);
    uVar21 = 0xffffffff;
    if (uStack_2e00._4_4_ != 0) {
      uVar23 = 0;
      do {
        if (*(int *)(uVar18 + 4) == (int)uVar23) break;
        if (*(char *)((long)piVar28 + uVar23) != *(char *)((long)piVar13 + uVar23)) {
          uVar21 = uVar23 & 0xffffffff;
          break;
        }
        uVar23 = uVar23 + 1;
      } while (uStack_2e00._4_4_ != (uint)uVar23);
    }
    if ((int)uVar21 == -1) {
      uVar3 = uStack_2e00._4_4_;
      if (uStack_2e00._4_4_ < *(uint *)(uVar18 + 4)) {
        uVar3 = *(uint *)(uVar18 + 4);
      }
      uVar21 = (ulong)(uVar3 - 1);
    }
    pcStack_2e88 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar21,uVar5,uVar9);
    pcStack_2e88 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar11 = (char *)(ulong)uVar3;
    pcStack_2e88 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_2e04 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_2e88 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_2e88 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_2e88 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar27 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar11 = (char *)((ulong)uStack_2e00 >> 0x20);
      pcStack_2e88 = (code *)0x133160;
      pdVar14 = (double *)write(uVar3,piVar28,(size_t)pcVar11);
      if (pdVar14 != (double *)pcVar11) goto LAB_00133191;
      uVar18 = (ulong)*(uint *)(uVar18 + 4);
      pcStack_2e88 = (code *)0x133176;
      uVar21 = write(uVar4,piVar13,uVar18);
      if (uVar21 == uVar18) {
        pcStack_2e88 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_2e88 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_2e88 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar24 = acStack_2ea0;
  acStack_2ea0[8] = '\0';
  acStack_2ea0[9] = '\0';
  acStack_2ea0[10] = '\0';
  acStack_2ea0[0xb] = '\0';
  acStack_2ea0[0xc] = '\0';
  acStack_2ea0[0xd] = '\0';
  acStack_2ea0[0xe] = '@';
  acStack_2ea0[0xf] = '0';
  acStack_2ea0[0] = '\v';
  acStack_2ea0[1] = '\0';
  acStack_2ea0[2] = '\0';
  acStack_2ea0[3] = '\0';
  acStack_2ea0[4] = '\0';
  acStack_2ea0[5] = '\0';
  acStack_2ea0[6] = '\0';
  acStack_2ea0[7] = '\0';
  pcStack_2eb0 = (code *)0x1331ce;
  pcStack_2e90 = (char *)uVar18;
  pcStack_2e88 = (code *)piVar13;
  plVar15 = (long *)bson_new();
  pcStack_2eb0 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar15,"decimal128",0xffffffff,pcVar24);
  if (cVar1 == '\0') {
    pcStack_2eb0 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_2eb0 = (code *)0x1331f7;
    pcVar24 = (char *)bson_as_json(plVar15,auStack_2ea8);
    if (pcVar24 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_2eb0 = (code *)0x133221;
      bson_free(pcVar24);
      pcStack_2eb0 = (code *)0x133229;
      bson_destroy(plVar15);
      return;
    }
    pcStack_2eb0 = (code *)0x133215;
    iVar2 = strcmp(pcVar24,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_2eb0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar30 = &pcStack_2eb0;
  pcStack_3308 = (code *)0x133271;
  plStack_2eb8 = plVar15;
  pcStack_2eb0 = (code *)&pcStack_2a88;
  cVar1 = bson_init_from_json(auStack_3200,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_3118);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_3308 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_3280,auStack_3200);
  if (cVar1 == '\0') {
    pcStack_3308 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_3308 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_3308 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_3308 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_3308 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_3280,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_3308 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_3280);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar15 = &lStack_3290;
    pcStack_3308 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_3280,plVar15);
    if (lStack_3290 != 0xb) goto LAB_0013330b;
    if (lStack_3288 == 0x3040000000000000) {
      pcStack_3308 = (code *)0x1332f5;
      bson_destroy(auStack_3200);
      return;
    }
  }
  pcStack_3308 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_3308 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar22 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar25 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_3320 = plVar15;
  pdStack_3318 = (double *)pcVar11;
  pcStack_3310 = pcVar24;
  pcStack_3308 = (code *)piVar28;
  do {
    pcStack_3530 = (code *)0x133357;
    lVar19 = bson_new_from_json(pcVar22,0xffffffffffffffff,&iStack_3520);
    if (lVar19 != 0) {
      pcStack_3530 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_3530 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_3518,
              piVar28);
      pcStack_3530 = (code *)0x1333c7;
      abort();
    }
    if (iStack_3520 != 1) {
LAB_001333cc:
      pcStack_3530 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_3748 = (code *)0x1333f1;
      pcStack_3538 = acStack_3518;
      pcStack_3530 = (code *)&iStack_3520;
      pcVar11 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_3738);
      pcStack_3748 = (code *)0x1333fe;
      pcVar24 = (char *)bson_as_json(pcVar11,0);
      if (pcVar24 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_3748 = (code *)0x133428;
        bson_free(pcVar24);
        pcStack_3748 = (code *)0x133430;
        bson_destroy(pcVar11);
        return;
      }
      pcStack_3748 = (code *)0x13341c;
      iVar2 = strcmp(pcVar24,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_3748 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_3958 = 0x2200223a2261227b;
      uStack_3950 = 0x7d;
      uStack_395c = 0x227b;
      pcStack_3748 = (code *)pcVar11;
      lVar19 = bson_new_from_json(&uStack_3958,9,&iStack_3948);
      if (lVar19 == 0) {
        if (iStack_3948 != 1) goto LAB_001334fc;
        if (iStack_3944 != 1) goto LAB_00133501;
        pcVar11 = acStack_3940;
        pcVar22 = strstr(pcVar11,"Got parse error");
        if (pcVar22 == (char *)0x0) goto LAB_00133506;
        lVar19 = bson_new_from_json(&uStack_395c,3,&iStack_3948);
        if (lVar19 != 0) goto LAB_001334f7;
        if (iStack_3948 != 1) goto LAB_0013350e;
        if (iStack_3944 == 1) {
          pcVar22 = strstr(pcVar11,"Got parse error");
          if (pcVar22 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar5 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar9 = bson_bcon_magic();
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0,uVar5,pcVar11,ppuVar25,ppuVar27,pcVar24,piVar28,ppcVar30)
      ;
      uVar16 = bcon_new(0,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar5,uVar16,0);
      uVar5 = bson_new();
      uVar16 = bson_new();
      uVar17 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar5,uVar16,uVar17,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,"b",uVar9,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar5,0);
      uVar5 = bcon_new(0,"a",uVar9,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar5,0);
      uVar5 = bson_new();
      _test_json_produces_multiple("[]",0,uVar5,0);
      uVar5 = bcon_new(0,"0","{","x",uVar9,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar5,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_351c != 2) {
      pcStack_3530 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar28 = (int *)ppuVar25[-1];
    pcStack_3530 = (code *)0x13337e;
    pcVar11 = strstr(acStack_3518,(char *)piVar28);
    if (pcVar11 == (char *)0x0) goto LAB_001333a4;
    pcVar22 = *ppuVar25;
    ppuVar25 = ppuVar25 + 2;
    if (pcVar22 == (char *)0x0) {
      return;
    }
  } while( true );
  while( true ) {
    if (*(char *)((long)pvStack_7f8 + uVar21) != *(char *)((long)pvVar7 + uVar21)) {
      uVar18 = uVar21 & 0xffffffff;
      break;
    }
    uVar21 = uVar21 + 1;
    if (uStack_77c == (uint)uVar21) break;
LAB_00131c84:
    if (*(int *)(puVar12 + 4) == (int)uVar21) break;
  }
LAB_00131c9e:
  if ((int)uVar18 == -1) {
    uVar3 = uStack_77c;
    if (uStack_77c < *(uint *)(puVar12 + 4)) {
      uVar3 = *(uint *)(puVar12 + 4);
    }
    uVar18 = (ulong)(uVar3 - 1);
  }
  apcStack_808[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar18,__s1,uVar5);
  apcStack_808[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_808[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_7f8 = (void *)CONCAT44(pvStack_7f8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_808[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_808[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_808[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)uStack_77c;
    apcStack_808[0] = (code *)0x131d2b;
    puVar10 = (undefined1 *)write(uVar3,pvVar6,(size_t)__n);
    if (puVar10 != __n) goto LAB_00131d5c;
    puVar12 = (undefined1 *)(ulong)*(uint *)(puVar12 + 4);
    apcStack_808[0] = (code *)0x131d41;
    puVar10 = (undefined1 *)write(uVar4,pvVar7,(size_t)puVar12);
    if (puVar10 == puVar12) {
      apcStack_808[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_808[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
  goto LAB_00131d66;
LAB_00132bff:
  apcStack_2308[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_2708[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_2708[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_2708[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar13 = &iStack_25b8;
  pcVar11 = (char *)&dStack_2688;
  piVar20 = aiStack_2680;
  piVar28 = (int *)0x14a6f6;
  apcStack_2708[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_2708[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_dbref (void)
{
   bson_error_t error;

   const char *json_with_objectid =
      "{ \"key\": {"
      "\"$ref\": \"collection\","
      "\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";

   bson_t *bson_with_objectid = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_OID (oid_zero ()),
                                          "}");

   const char *json_with_int_id = "{ \"key\": {"
                                  "\"$ref\": \"collection\","
                                  "\"$id\": 1}}";

   bson_t *bson_with_int_id = BCON_NEW (
      "key", "{", "$ref", BCON_UTF8 ("collection"), "$id", BCON_INT32 (1), "}");

   const char *json_with_subdoc_id = "{ \"key\": {"
                                     "\"$ref\": \"collection\","
                                     "\"$id\": {\"a\": 1}}}";

   bson_t *bson_with_subdoc_id = BCON_NEW ("key",
                                           "{",
                                           "$ref",
                                           BCON_UTF8 ("collection"),
                                           "$id",
                                           "{",
                                           "a",
                                           BCON_INT32 (1),
                                           "}",
                                           "}");

   const char *json_with_metadata = "{ \"key\": {"
                                    "\"$ref\": \"collection\","
                                    "\"$id\": 1,"
                                    "\"meta\": true}}";

   bson_t *bson_with_metadata = BCON_NEW ("key",
                                          "{",
                                          "$ref",
                                          BCON_UTF8 ("collection"),
                                          "$id",
                                          BCON_INT32 (1),
                                          "meta",
                                          BCON_BOOL (true),
                                          "}");

   bson_t b;
   bool r;

   typedef struct {
      const char *json;
      bson_t *expected_bson;
   } dbref_test_t;

   dbref_test_t tests[] = {
      {json_with_objectid, bson_with_objectid},
      {json_with_int_id, bson_with_int_id},
      {json_with_subdoc_id, bson_with_subdoc_id},
      {json_with_metadata, bson_with_metadata},
   };

   int n_tests = sizeof (tests) / sizeof (dbref_test_t);
   int i;

   for (i = 0; i < n_tests; i++) {
      r = bson_init_from_json (&b, tests[i].json, -1, &error);
      if (!r) {
         fprintf (stderr, "%s\n", error.message);
      }

      BSON_ASSERT (r);
      bson_eq_bson (&b, tests[i].expected_bson);
      bson_destroy (&b);
   }

   for (i = 0; i < n_tests; i++) {
      bson_destroy (tests[i].expected_bson);
   }
}